

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O0

void ihevc_weighted_pred_chroma_bi_default
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  int local_3c;
  UWORD8 local_38;
  WORD32 shift;
  WORD32 i4_tmp;
  WORD32 col;
  WORD32 row;
  WORD32 dst_strd_local;
  WORD32 src_strd2_local;
  WORD32 src_strd1_local;
  UWORD8 *pu1_dst_local;
  WORD16 *pi2_src2_local;
  WORD16 *pi2_src1_local;
  
  pu1_dst_local = pu1_dst;
  pi2_src2_local = pi2_src2;
  pi2_src1_local = pi2_src1;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; SBORROW4(col,wd * 2) != col + wd * -2 < 0; col = col + 1) {
      local_3c = pi2_src2_local[col] + lvl_shift2 + pi2_src1_local[col] + lvl_shift1 + 0x40 >> 7;
      if (local_3c < 0x100) {
        if (local_3c < 0) {
          local_3c = 0;
        }
        local_38 = (UWORD8)local_3c;
      }
      else {
        local_38 = 0xff;
      }
      pu1_dst_local[col] = local_38;
    }
    pi2_src1_local = pi2_src1_local + src_strd1;
    pi2_src2_local = pi2_src2_local + src_strd2;
    pu1_dst_local = pu1_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi_default(WORD16 *pi2_src1,
                                           WORD16 *pi2_src2,
                                           UWORD8 *pu1_dst,
                                           WORD32 src_strd1,
                                           WORD32 src_strd2,
                                           WORD32 dst_strd,
                                           WORD32 lvl_shift1,
                                           WORD32 lvl_shift2,
                                           WORD32 ht,
                                           WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;
    WORD32 shift;

    shift = SHIFT_14_MINUS_BIT_DEPTH + 1;
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = pi2_src1[col] + lvl_shift1;
            i4_tmp += pi2_src2[col] + lvl_shift2;
            i4_tmp += 1 << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}